

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.hpp
# Opt level: O2

void __thiscall OpenMD::GB::~GB(GB *this)

{
  ~GB(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }